

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_Constractor_bytedata33_Test::~ConfidentialValue_Constractor_bytedata33_Test
          (ConfidentialValue_Constractor_bytedata33_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_bytedata33) {
  // 33byte
  ConfidentialValue value(
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_STREQ(
      value.GetHex().c_str(),
      "09b6e7605917e27f35690dcae922f664c8a3b057e2c6249db6cd304096aa87a226");
  EXPECT_EQ(value.GetData().GetDataSize(), 33);
  EXPECT_EQ(value.HasBlinding(), true);
  EXPECT_EQ(value.GetAmount().GetSatoshiValue(), 0);
}